

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

Symbol left_section_op(Env *env,uint32_t start)

{
  bool bVar1;
  Space SVar2;
  Symbol SVar3;
  State *extraout_RAX;
  State *pSVar4;
  uint uVar5;
  TSLexer *pTVar6;
  
  if (env->symbols[0x27] == true) {
    advance_before(env,start);
    SVar2 = skip_whitespace(env);
    pSVar4 = env->state;
    uVar5 = (pSVar4->lookahead).offset + start;
    if (uVar5 < (pSVar4->lookahead).size) {
      pTVar6 = (TSLexer *)((pSVar4->lookahead).contents + uVar5);
    }
    else {
      advance_before(env,start);
      pTVar6 = env->lexer;
      pSVar4 = extraout_RAX;
    }
    if (pTVar6->lookahead == 0x29) {
      bVar1 = false;
      SVar3 = LEFT_SECTION_OP;
    }
    else if (SVar2 == NoSpace) {
      bVar1 = true;
      SVar3 = (Symbol)pSVar4;
    }
    else {
      bVar1 = false;
      SVar3 = NO_SECTION_OP;
      if (env->symbols[0x28] == false) {
        SVar3 = FAIL;
      }
    }
    if (!bVar1) {
      return SVar3;
    }
  }
  return FAIL;
}

Assistant:

static Symbol left_section_op(Env *env, uint32_t start) {
  if (valid(env, LEFT_SECTION_OP)) {
    advance_before(env, start);
    Space space = skip_whitespace(env);
    if (char_at(env, start, ')')) return finish(LEFT_SECTION_OP, "left section");
    if (space != NoSpace) return finish_if_valid(env, NO_SECTION_OP, "left section");
  }
  return FAIL;
}